

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# party.cpp
# Opt level: O0

void __thiscall Party::Msg(Party *this,Character *from,string *message,bool echo)

{
  World *pWVar1;
  Character *this_00;
  bool bVar2;
  int iVar3;
  int iVar4;
  mapped_type *this_01;
  long lVar5;
  reference ppCVar6;
  string local_1c0;
  string local_1a0;
  allocator<char> local_179;
  string local_178;
  Character *local_158;
  Character *member;
  iterator __end1;
  iterator __begin1;
  vector<Character_*,_std::allocator<Character_*>_> *__range1;
  PacketBuilder builder;
  string local_100;
  string local_e0;
  string local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  allocator<char> local_69;
  key_type local_68;
  string local_48;
  byte local_21;
  string *psStack_20;
  bool echo_local;
  string *message_local;
  Character *from_local;
  Party *this_local;
  
  pWVar1 = this->world;
  local_21 = echo;
  psStack_20 = message;
  message_local = (string *)from;
  from_local = (Character *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"ChatMaxWidth",&local_69);
  this_01 = std::
            unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
            ::operator[](&(pWVar1->config).
                          super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                         ,&local_68);
  iVar3 = util::variant::operator_cast_to_int(this_01);
  (**(code **)(*(long *)message_local + 0x10))(&local_e0);
  util::ucfirst(&local_c0,&local_e0);
  std::operator+(&local_a0,&local_c0,"  ");
  iVar4 = util::text_width(&local_a0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_100,"...",(allocator<char> *)((long)&builder.add_size + 7));
  util::text_cap(&local_48,message,iVar3 - iVar4,&local_100);
  std::__cxx11::string::operator=((string *)message,(string *)&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_100);
  std::allocator<char>::~allocator((allocator<char> *)((long)&builder.add_size + 7));
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator(&local_69);
  lVar5 = std::__cxx11::string::length();
  PacketBuilder::PacketBuilder((PacketBuilder *)&__range1,PACKET_TALK,PACKET_OPEN,lVar5 + 2);
  iVar3 = Character::PlayerID((Character *)message_local);
  PacketBuilder::AddShort((PacketBuilder *)&__range1,iVar3);
  PacketBuilder::AddString((PacketBuilder *)&__range1,message);
  __end1 = std::vector<Character_*,_std::allocator<Character_*>_>::begin(&this->members);
  member = (Character *)std::vector<Character_*,_std::allocator<Character_*>_>::end(&this->members);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<Character_**,_std::vector<Character_*,_std::allocator<Character_*>_>_>
                                     *)&member), bVar2) {
    ppCVar6 = __gnu_cxx::
              __normal_iterator<Character_**,_std::vector<Character_*,_std::allocator<Character_*>_>_>
              ::operator*(&__end1);
    this_00 = *ppCVar6;
    local_158 = this_00;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_178,"\'",&local_179);
    (**(code **)(*(long *)message_local + 0x10))(&local_1a0);
    std::__cxx11::string::string((string *)&local_1c0,(string *)message);
    Character::AddChatLog(this_00,&local_178,&local_1a0,&local_1c0);
    std::__cxx11::string::~string((string *)&local_1c0);
    std::__cxx11::string::~string((string *)&local_1a0);
    std::__cxx11::string::~string((string *)&local_178);
    std::allocator<char>::~allocator(&local_179);
    if (((local_21 & 1) != 0) || (local_158 != (Character *)message_local)) {
      Character::Send(local_158,(PacketBuilder *)&__range1);
    }
    __gnu_cxx::
    __normal_iterator<Character_**,_std::vector<Character_*,_std::allocator<Character_*>_>_>::
    operator++(&__end1);
  }
  PacketBuilder::~PacketBuilder((PacketBuilder *)&__range1);
  return;
}

Assistant:

void Party::Msg(Character *from, std::string message, bool echo)
{
	message = util::text_cap(message, static_cast<int>(this->world->config["ChatMaxWidth"]) - util::text_width(util::ucfirst(from->SourceName()) + "  "));

	PacketBuilder builder(PACKET_TALK, PACKET_OPEN, 2 + message.length());

	builder.AddShort(from->PlayerID());
	builder.AddString(message);

	UTIL_FOREACH(this->members, member)
	{
		member->AddChatLog("'", from->SourceName(), message);

		if (!echo && member == from)
			continue;

		member->Send(builder);
	}
}